

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddAction
          (TransitionObservationIndependentMADPDiscrete *this,Index agentI,string *name)

{
  pointer ppMVar1;
  MultiAgentDecisionProcessDiscrete *pMVar2;
  EInvalidIndex *this_00;
  allocator<char> local_31;
  string local_30;
  
  ppMVar1 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_individualMADPDs).
                    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
    pMVar2 = ppMVar1[agentI];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
    MADPComponentDiscreteActions::AddAction(&pMVar2->_m_A,0,name,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
  EInvalidIndex::EInvalidIndex
            (this_00,
             "TransitionObservationIndependentMADPDiscrete::AddAction - agentI out of bounds...");
  __cxa_throw(this_00,&EInvalidIndex::typeinfo,E::~E);
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddAction(Index agentI, const string &name)
{
    if(agentI >= _m_individualMADPDs.size())
        throw EInvalidIndex("TransitionObservationIndependentMADPDiscrete::AddAction - agentI out of bounds...");
    _m_individualMADPDs[agentI]->AddAction(0, name);    
}